

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void cf_socket_update_data(Curl_cfilter *cf,Curl_easy *data)

{
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if (((cf->field_0x24 & 1) != 0) && (cf->sockindex == 0)) {
    memcpy(&(data->info).primary,(void *)((long)cf->ctx + 0x9c),100);
    (data->info).conn_remote_port = cf->conn->remote_port;
  }
  return;
}

Assistant:

static void cf_socket_update_data(struct Curl_cfilter *cf,
                                  struct Curl_easy *data)
{
  /* Update the IP info held in the transfer, if we have that. */
  if(cf->connected && (cf->sockindex == FIRSTSOCKET)) {
    struct cf_socket_ctx *ctx = cf->ctx;
    data->info.primary = ctx->ip;
    /* not sure if this is redundant... */
    data->info.conn_remote_port = cf->conn->remote_port;
  }
}